

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::TypedFloatConstantGenerator::Value
          (string *__return_storage_ptr__,TypedFloatConstantGenerator *this,float v,string *src)

{
  string *src_local;
  float v_local;
  TypedFloatConstantGenerator *this_local;
  
  std::operator+(__return_storage_ptr__,src,"f");
  return __return_storage_ptr__;
}

Assistant:

std::string TypedFloatConstantGenerator::Value(float v,
                                               const std::string &src) const {
  (void)v;
  return src + "f";
}